

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

double r8_factorial(int n)

{
  int iVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  
  iVar1 = 0;
  if (0 < n) {
    iVar1 = n;
  }
  dVar4 = 1.0;
  dVar3 = 1.0;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    dVar3 = dVar3 * dVar4;
    dVar4 = dVar4 + 1.0;
  }
  return dVar3;
}

Assistant:

double r8_factorial ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    R8_FACTORIAL computes the factorial of N.
//
//  Discussion:
//
//    factorial ( N ) = product ( 1 <= I <= N ) I
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 January 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the argument of the factorial function.
//    If N is less than 1, the function value is returned as 1.
//
//    Output, double R8_FACTORIAL, the factorial of N.
//
{
  int i;
  double value;

  value = 1.0;

  for ( i = 1; i <= n; i++ )
  {
    value = value * double( i );
  }

  return value;
}